

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O1

void __thiscall HDWallet_ConvertTest_Test::TestBody(HDWallet_ConvertTest_Test *this)

{
  bool bVar1;
  internal iVar2;
  pointer __x;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  actual_mnemonic;
  ByteData actual_seed;
  ByteData copy_seed;
  HDWallet copy_wallet;
  HDWallet hd_wallet;
  ByteData actual_entropy;
  Bip39TestVector test_vector;
  AssertHelper local_1a0;
  string local_198;
  byte local_169;
  pointer local_168;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_160;
  pointer local_158;
  AssertHelper local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  ByteData local_130;
  ByteData local_118;
  ByteData local_100;
  ByteData local_e8;
  ByteData local_d0;
  string local_b8;
  ByteData local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  ByteData local_68;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cfd::core::ByteData::ByteData(&local_d0);
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ByteData::ByteData(&local_130);
  cfd::core::HDWallet::HDWallet((HDWallet *)&local_e8);
  cfd::core::HDWallet::HDWallet((HDWallet *)&local_100);
  cfd::core::ByteData::ByteData(&local_118);
  local_50 = bip39_test_vectors.
             super__Vector_base<Bip39TestVector,_std::allocator<Bip39TestVector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (bip39_test_vectors.super__Vector_base<Bip39TestVector,_std::allocator<Bip39TestVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      bip39_test_vectors.super__Vector_base<Bip39TestVector,_std::allocator<Bip39TestVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __x = bip39_test_vectors.super__Vector_base<Bip39TestVector,_std::allocator<Bip39TestVector>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_98.data_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_80,&__x->mnemonic);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_68.data_,&(__x->seed).data_);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_80);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,test_passphrase_abi_cxx11_._M_dataplus._M_p,
                     test_passphrase_abi_cxx11_._M_dataplus._M_p +
                     test_passphrase_abi_cxx11_._M_string_length);
          cfd::core::HDWallet::HDWallet((HDWallet *)&local_198,&local_48,&local_b8,false);
          cfd::core::ByteData::operator=(&local_e8,(ByteData *)&local_198);
          if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
            operator_delete(local_198._M_dataplus._M_p,
                            local_198.field_2._M_allocated_capacity -
                            (long)local_198._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
      }
      else {
        testing::Message::Message((Message *)&local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc2,
                   "Expected: hd_wallet = HDWallet(test_vector.mnemonic, test_passphrase) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_198)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
        if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
          }
          local_198._M_dataplus._M_p = (pointer)0x0;
        }
      }
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          cfd::core::HDWallet::GetSeed((ByteData *)&local_198,(HDWallet *)&local_e8);
          cfd::core::ByteData::operator=(&local_130,(ByteData *)&local_198);
          if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
            operator_delete(local_198._M_dataplus._M_p,
                            local_198.field_2._M_allocated_capacity -
                            (long)local_198._M_dataplus._M_p);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc3,
                   "Expected: actual_seed = hd_wallet.GetSeed() doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_198)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
        if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
          }
          local_198._M_dataplus._M_p = (pointer)0x0;
        }
      }
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          cfd::core::HDWallet::ConvertMnemonicToEntropy
                    ((ByteData *)&local_198,&local_80,&language_abi_cxx11_);
          cfd::core::ByteData::operator=(&local_d0,(ByteData *)&local_198);
          if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
            operator_delete(local_198._M_dataplus._M_p,
                            local_198.field_2._M_allocated_capacity -
                            (long)local_198._M_dataplus._M_p);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc4,
                   "Expected: actual_entropy = HDWallet::ConvertMnemonicToEntropy(test_vector.mnemonic, language) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_198)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
        if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
          }
          local_198._M_dataplus._M_p = (pointer)0x0;
        }
      }
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          cfd::core::HDWallet::ConvertEntropyToMnemonic
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_168,&local_98,&language_abi_cxx11_);
          local_198.field_2._M_allocated_capacity =
               (size_type)
               local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_198._M_string_length =
               (size_type)
               local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_198._M_dataplus._M_p =
               (pointer)local_148.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_168;
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = sStack_160.ptr_;
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_158;
          local_168 = (pointer)0x0;
          sStack_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_158 = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_198);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_168);
        }
      }
      else {
        testing::Message::Message((Message *)&local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc5,
                   "Expected: actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(test_vector.entropy, language) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_198)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
        if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
          }
          local_198._M_dataplus._M_p = (pointer)0x0;
        }
      }
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          local_169 = cfd::core::HDWallet::CheckValidMnemonic(&local_80,&language_abi_cxx11_);
        }
      }
      else {
        testing::Message::Message((Message *)&local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc6,
                   "Expected: actual_is_valid = HDWallet::CheckValidMnemonic(test_vector.mnemonic, language) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_198)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
        if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
          }
          local_198._M_dataplus._M_p = (pointer)0x0;
        }
      }
      bVar1 = cfd::core::ByteData::Equals(&local_d0,&local_98);
      local_168 = (pointer)CONCAT71(local_168._1_7_,bVar1);
      sStack_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_198,(internal *)&local_168,
                   (AssertionResult *)"actual_entropy.Equals(test_vector.entropy)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,199,local_198._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_1a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_1a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1a0.data_ + 8))();
          }
          local_1a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::
      CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((internal *)&local_198,"actual_mnemonic","test_vector.mnemonic",&local_148,
                 &local_80);
      if ((char)local_198._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_168);
        message = "";
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_198._M_string_length !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((_Alloc_hider *)local_198._M_string_length)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,200,message);
        testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        if (local_168 != (pointer)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_168 != (pointer)0x0)) {
            (**(code **)(*(long *)local_168 + 8))();
          }
          local_168 = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_198._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar2 = (internal)cfd::core::ByteData::Equals(&local_130,&local_68);
      sStack_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_168._0_1_ = iVar2;
      if (!(bool)iVar2) {
        testing::Message::Message((Message *)&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_198,(internal *)&local_168,
                   (AssertionResult *)"actual_seed.Equals(test_vector.seed)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc9,local_198._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_1a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_1a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1a0.data_ + 8))();
          }
          local_1a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_168 = (pointer)CONCAT71(local_168._1_7_,local_169);
      sStack_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_169 & 1) == 0) {
        testing::Message::Message((Message *)&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_198,(internal *)&local_168,(AssertionResult *)"actual_is_valid","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xca,local_198._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_1a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_1a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1a0.data_ + 8))();
          }
          local_1a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      cfd::core::HDWallet::HDWallet((HDWallet *)&local_198,&local_130);
      cfd::core::ByteData::operator=(&local_100,(ByteData *)&local_198);
      if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_198._M_dataplus._M_p,
                        local_198.field_2._M_allocated_capacity - (long)local_198._M_dataplus._M_p);
      }
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          cfd::core::HDWallet::GetSeed((ByteData *)&local_198,(HDWallet *)&local_100);
          cfd::core::ByteData::operator=(&local_118,(ByteData *)&local_198);
          if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
            operator_delete(local_198._M_dataplus._M_p,
                            local_198.field_2._M_allocated_capacity -
                            (long)local_198._M_dataplus._M_p);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xcd,
                   "Expected: copy_seed = copy_wallet.GetSeed() doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_198)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
        if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_198._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
          }
          local_198._M_dataplus._M_p = (pointer)0x0;
        }
      }
      bVar1 = cfd::core::ByteData::Equals(&local_118,&local_68);
      local_168 = (pointer)CONCAT71(local_168._1_7_,bVar1);
      sStack_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_198,(internal *)&local_168,
                   (AssertionResult *)"copy_seed.Equals(test_vector.seed)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xce,local_198._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_1a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_1a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1a0.data_ + 8))();
          }
          local_1a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_80);
      if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != local_50);
  }
  if (local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_100.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if (local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HDWallet, ConvertTest) {
  ByteData actual_entropy;
  std::vector<std::string> actual_mnemonic;
  ByteData actual_seed;
  bool actual_is_valid;
  HDWallet hd_wallet;

  HDWallet copy_wallet;
  ByteData copy_seed;
  for (Bip39TestVector test_vector : bip39_test_vectors) {
    EXPECT_NO_THROW(hd_wallet = HDWallet(test_vector.mnemonic, test_passphrase));
    EXPECT_NO_THROW(actual_seed = hd_wallet.GetSeed());
    EXPECT_NO_THROW(actual_entropy = HDWallet::ConvertMnemonicToEntropy(test_vector.mnemonic, language));
    EXPECT_NO_THROW(actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(test_vector.entropy, language));
    EXPECT_NO_THROW(actual_is_valid = HDWallet::CheckValidMnemonic(test_vector.mnemonic, language));
    EXPECT_TRUE(actual_entropy.Equals(test_vector.entropy));
    EXPECT_EQ(actual_mnemonic, test_vector.mnemonic);
    EXPECT_TRUE(actual_seed.Equals(test_vector.seed));
    EXPECT_TRUE(actual_is_valid);

    copy_wallet = HDWallet(actual_seed);
    EXPECT_NO_THROW(copy_seed = copy_wallet.GetSeed());
    EXPECT_TRUE(copy_seed.Equals(test_vector.seed));
  }
}